

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

char * ODDLParser::OpenDDLParser::parseHexaLiteral(char *in,char *end,Value **data)

{
  bool bVar1;
  uint uVar2;
  Value *this;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  
  *data = (Value *)0x0;
  if ((in != end && in != (char *)0x0) &&
     (pcVar4 = end, in = lookForNextToken<char>(in,end), *in == '0')) {
    if ((byte)(in[1] | 0x20U) == 0x78) {
      pcVar6 = in + 2;
      uVar5 = 0;
      while( true ) {
        in = pcVar6 + uVar5;
        bVar1 = isSeparator<char>((ODDLParser *)(ulong)(uint)(int)pcVar6[uVar5],(char)pcVar4);
        if ((in == end) || (bVar1)) break;
        uVar5 = uVar5 + 1;
      }
      uVar3 = 0;
      for (; 0 < (int)uVar5; uVar5 = (ulong)((int)uVar5 - 1)) {
        uVar2 = hex2Decimal(*pcVar6);
        uVar3 = uVar3 << 4 | uVar2;
        pcVar6 = pcVar6 + 1;
      }
      this = ValueAllocator::allocPrimData(ddl_unsigned_int64,1);
      *data = this;
      if (this != (Value *)0x0) {
        Value::setUnsignedInt64(this,(long)(int)uVar3);
      }
    }
    else {
      in = in + 1;
    }
  }
  return in;
}

Assistant:

char *OpenDDLParser::parseHexaLiteral( char *in, char *end, Value **data ) {
    *data = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    if( *in != '0' ) {
        return in;
    }

    ++in;
    if( *in != 'x' && *in != 'X' ) {
        return in;
    }

    ++in;
    bool ok( true );
    char *start( in );
    int pos( 0 );
    while( !isSeparator( *in ) && in != end ) {
        if( ( *in < '0' && *in > '9' ) || ( *in < 'a' && *in > 'f' ) || ( *in < 'A' && *in > 'F' ) ) {
            ok = false;
            break;
        }
        ++pos;
        ++in;
    }

    if( !ok ) {
        return in;
    }

    int value( 0 );
    while( pos > 0 ) {
        int v = hex2Decimal( *start );
        --pos;
        value = ( value << 4 ) | v;
        ++start;
    }

    *data = ValueAllocator::allocPrimData( Value::ddl_unsigned_int64 );
    if( ddl_nullptr != *data ) {
        ( *data )->setUnsignedInt64( value );
    }

    return in;
}